

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O2

unsigned_short __thiscall
Type1ToCFFEmbeddedFontWriter::AddStringToStringsArray
          (Type1ToCFFEmbeddedFontWriter *this,string *inString)

{
  int iVar1;
  int iVar2;
  unsigned_short uVar3;
  BoolAndUShort BVar4;
  iterator iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_bool>
  pVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_50;
  
  BVar4 = FindStandardString(this,inString);
  if (((uint)BVar4 & 1) == 0) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
            ::find(&(this->mNonStandardStringToIndex)._M_t,inString);
    if ((_Rb_tree_header *)iVar5._M_node ==
        &(this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header) {
      iVar1 = *(int *)&(this->mStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      iVar2 = *(int *)&(this->mStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_50,(string *)inString);
      local_50.second = (unsigned_short)((uint)(iVar1 - iVar2) >> 5);
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_short>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_short>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>>
                          *)&this->mNonStandardStringToIndex,&local_50);
      iVar5._M_node = (_Base_ptr)pVar6.first._M_node;
      std::__cxx11::string::~string((string *)&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->mStrings,inString);
    }
    uVar3 = (short)iVar5._M_node[2]._M_color + 0x187;
  }
  else {
    uVar3 = BVar4.second;
  }
  return uVar3;
}

Assistant:

unsigned short Type1ToCFFEmbeddedFontWriter::AddStringToStringsArray(const std::string& inString)
{
	// first - see if this string exists in the standard strings array
	BoolAndUShort findResult = FindStandardString(inString);	

	if(findResult.first)
	{
		// it is - return the index in the standard strings array
		return findResult.second;
	}

	// it's not - add to strings vector and return the index
	StringToUShortMap::iterator it = mNonStandardStringToIndex.find(inString);
	if(it == mNonStandardStringToIndex.end())
	{
		it = mNonStandardStringToIndex.insert(StringToUShortMap::value_type(inString,(unsigned short)mStrings.size())).first;
		mStrings.push_back(inString);
	}
	return it->second + N_STD_STRINGS;
}